

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

String * Rml::StringUtilities::Replace
                   (String *__return_storage_ptr__,String *subject,char search,char replace)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  sVar1 = subject->_M_string_length;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    pcVar2 = (subject->_M_dataplus)._M_p;
    if (pcVar2[sVar3] == search) {
      pcVar2[sVar3] = replace;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)subject);
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::Replace(String subject, char search, char replace)
{
	const size_t size = subject.size();
	for (size_t i = 0; i < size; i++)
	{
		if (subject[i] == search)
			subject[i] = replace;
	}
	return subject;
}